

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O2

void hts_idx_save_core(hts_idx_t *idx,void *fp,int fmt)

{
  bidx_t *pbVar1;
  bins_t *pbVar2;
  lidx_t *plVar3;
  long lVar4;
  uint is_bgzf;
  uint is_bgzf_00;
  ulong uVar5;
  byte bVar6;
  int32_t size;
  int local_5c;
  hts_idx_t *local_58;
  int32_t *local_50;
  lidx_t *local_48;
  long local_40;
  long local_38;
  
  local_50 = &idx->n;
  is_bgzf = (uint)(fmt != 1);
  idx_write(is_bgzf,fp,local_50,4);
  local_5c = fmt;
  if ((fmt == 2) && ((ulong)idx->l_meta != 0)) {
    idx_write(is_bgzf,fp,idx->meta,(ulong)idx->l_meta);
  }
  lVar4 = 0;
  local_58 = idx;
  while (is_bgzf_00 = (uint)(fmt != 1), lVar4 < *local_50) {
    pbVar1 = local_58->bidx[lVar4];
    local_48 = local_58->lidx + lVar4;
    local_40 = lVar4;
    if (pbVar1 == (bidx_t *)0x0) {
      size = 0;
      idx_write(is_bgzf,fp,&size,4);
    }
    else {
      size = pbVar1->size;
      idx_write(is_bgzf,fp,&size,4);
      bVar6 = 0;
      for (uVar5 = 0; (khint_t)uVar5 != pbVar1->n_buckets; uVar5 = (ulong)((khint_t)uVar5 + 1)) {
        if ((pbVar1->flags[uVar5 >> 4] >> (bVar6 & 0x1e) & 3) == 0) {
          local_38 = uVar5 * 0x18;
          pbVar2 = pbVar1->vals;
          idx_write(is_bgzf,fp,pbVar1->keys + uVar5,4);
          if (local_5c == 0) {
            idx_write(is_bgzf,fp,(void *)((long)&pbVar1->vals->loff + local_38),8);
          }
          idx_write(is_bgzf,fp,&pbVar2[uVar5].n,4);
          idx_write(is_bgzf,fp,pbVar2[uVar5].list,(long)(pbVar2[uVar5].n << 4));
        }
        bVar6 = bVar6 + 2;
      }
    }
    plVar3 = local_48;
    if (local_5c != 0) {
      idx_write(is_bgzf_00,fp,local_48,4);
      idx_write(is_bgzf_00,fp,plVar3->offset,(long)(plVar3->n << 3));
    }
    lVar4 = local_40 + 1;
  }
  idx_write(is_bgzf_00,fp,&local_58->n_no_coor,8);
  return;
}

Assistant:

static void hts_idx_save_core(const hts_idx_t *idx, void *fp, int fmt)
{
    int32_t i, size, is_be;
    int is_bgzf = (fmt != HTS_FMT_BAI);
    is_be = ed_is_big();
    if (is_be) {
        uint32_t x = idx->n;
        idx_write(is_bgzf, fp, ed_swap_4p(&x), 4);
    } else idx_write(is_bgzf, fp, &idx->n, 4);
    if (fmt == HTS_FMT_TBI && idx->l_meta) idx_write(is_bgzf, fp, idx->meta, idx->l_meta);
    for (i = 0; i < idx->n; ++i) {
        khint_t k;
        bidx_t *bidx = idx->bidx[i];
        lidx_t *lidx = &idx->lidx[i];
        // write binning index
        size = bidx? kh_size(bidx) : 0;
        if (is_be) { // big endian
            uint32_t x = size;
            idx_write(is_bgzf, fp, ed_swap_4p(&x), 4);
        } else idx_write(is_bgzf, fp, &size, 4);
        if (bidx == 0) goto write_lidx;
        for (k = kh_begin(bidx); k != kh_end(bidx); ++k) {
            bins_t *p;
            if (!kh_exist(bidx, k)) continue;
            p = &kh_value(bidx, k);
            if (is_be) { // big endian
                uint32_t x;
                x = kh_key(bidx, k); idx_write(is_bgzf, fp, ed_swap_4p(&x), 4);
                if (fmt == HTS_FMT_CSI) {
                    uint64_t y = kh_val(bidx, k).loff;
                    idx_write(is_bgzf, fp, ed_swap_4p(&y), 8);
                }
                x = p->n; idx_write(is_bgzf, fp, ed_swap_4p(&x), 4);
                swap_bins(p);
                idx_write(is_bgzf, fp, p->list, 16 * p->n);
                swap_bins(p);
            } else {
                idx_write(is_bgzf, fp, &kh_key(bidx, k), 4);
                if (fmt == HTS_FMT_CSI) idx_write(is_bgzf, fp, &kh_val(bidx, k).loff, 8);
                //int j;for(j=0;j<p->n;++j)fprintf(stderr,"%d,%llx,%d,%llx:%llx\n",kh_key(bidx,k),kh_val(bidx, k).loff,j,p->list[j].u,p->list[j].v);
                idx_write(is_bgzf, fp, &p->n, 4);
                idx_write(is_bgzf, fp, p->list, p->n << 4);
            }
        }
write_lidx:
        if (fmt != HTS_FMT_CSI) {
            if (is_be) {
                int32_t x = lidx->n;
                idx_write(is_bgzf, fp, ed_swap_4p(&x), 4);
                for (x = 0; x < lidx->n; ++x) ed_swap_8p(&lidx->offset[x]);
                idx_write(is_bgzf, fp, lidx->offset, lidx->n << 3);
                for (x = 0; x < lidx->n; ++x) ed_swap_8p(&lidx->offset[x]);
            } else {
                idx_write(is_bgzf, fp, &lidx->n, 4);
                idx_write(is_bgzf, fp, lidx->offset, lidx->n << 3);
            }
        }
    }
    if (is_be) { // write the number of reads without coordinates
        uint64_t x = idx->n_no_coor;
        idx_write(is_bgzf, fp, &x, 8);
    } else idx_write(is_bgzf, fp, &idx->n_no_coor, 8);
}